

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O3

void AddFormatsToMetaMetaInfo(SstStream Stream,_TimestepMetadataMsg *Msg)

{
  int iVar1;
  size_t __size;
  size_t __size_00;
  int iVar2;
  _SstMetaMetaBlockInternal *__ptr;
  char *__dest;
  char *__dest_00;
  FFSFormatList pFVar3;
  
  pFVar3 = Msg->Formats;
  if (pFVar3 != (FFSFormatList)0x0) {
    __ptr = Stream->InternalMetaMetaInfo;
    iVar2 = Stream->InternalMetaMetaCount;
    do {
      __ptr = (_SstMetaMetaBlockInternal *)realloc(__ptr,(long)iVar2 * 0x28 + 0x28);
      Stream->InternalMetaMetaInfo = __ptr;
      iVar1 = Stream->InternalMetaMetaCount;
      iVar2 = iVar1 + 1;
      Stream->InternalMetaMetaCount = iVar2;
      __ptr[iVar1].TimestepAdded = Msg->Timestep;
      __size = pFVar3->FormatIDRepLen;
      __dest = (char *)malloc(__size);
      __ptr[iVar1].ID = __dest;
      __ptr[iVar1].IDSize = __size;
      __size_00 = pFVar3->FormatServerRepLen;
      __dest_00 = (char *)malloc(__size_00);
      __ptr[iVar1].BlockData = __dest_00;
      __ptr[iVar1].BlockSize = __size_00;
      memcpy(__dest,pFVar3->FormatIDRep,__size);
      memcpy(__dest_00,pFVar3->FormatServerRep,pFVar3->FormatServerRepLen);
      pFVar3 = pFVar3->Next;
    } while (pFVar3 != (FFSFormatBlock *)0x0);
  }
  return;
}

Assistant:

void AddFormatsToMetaMetaInfo(SstStream Stream, struct _TimestepMetadataMsg *Msg)
{
    FFSFormatList Formats = Msg->Formats;
    STREAM_ASSERT_LOCKED(Stream);
    while (Formats)
    {
        Stream->InternalMetaMetaInfo =
            realloc(Stream->InternalMetaMetaInfo, (sizeof(struct _SstMetaMetaBlockInternal) *
                                                   (Stream->InternalMetaMetaCount + 1)));
        struct _SstMetaMetaBlockInternal *NewInfo =
            &Stream->InternalMetaMetaInfo[Stream->InternalMetaMetaCount];
        Stream->InternalMetaMetaCount++;
        NewInfo->TimestepAdded = Msg->Timestep;
        NewInfo->ID = malloc(Formats->FormatIDRepLen);
        NewInfo->IDSize = Formats->FormatIDRepLen;
        NewInfo->BlockData = malloc(Formats->FormatServerRepLen);
        NewInfo->BlockSize = Formats->FormatServerRepLen;
        memcpy(NewInfo->ID, Formats->FormatIDRep, Formats->FormatIDRepLen);
        memcpy(NewInfo->BlockData, Formats->FormatServerRep, Formats->FormatServerRepLen);
        Formats = Formats->Next;
    }
}